

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitRefAs(FunctionValidator *this,RefAs *curr)

{
  bool bVar1;
  Module *pMVar2;
  HeapType local_58;
  Type local_50;
  Type local_48;
  BasicType local_3c;
  HeapType local_38;
  Type local_30;
  Type local_28;
  BasicType local_1c;
  RefAs *local_18;
  RefAs *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (RefAs *)this;
  if (curr->op == ExternInternalize) {
    pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    bVar1 = FeatureSet::hasGC(&pMVar2->features);
    shouldBeTrue<wasm::RefAs*>(this,bVar1,local_18,"extern.internalize requries GC [--enable-gc]");
    local_1c = unreachable;
    bVar1 = wasm::Type::operator==
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)72>).
                        super_Expression.type,&local_1c);
    if (!bVar1) {
      local_28.id = (local_18->value->type).id;
      HeapType::HeapType(&local_38,ext);
      wasm::Type::Type(&local_30,local_38,Nullable);
      shouldBeSubType(this,local_28,local_30,local_18->value,
                      "extern.internalize value should be an externref");
    }
  }
  else if (curr->op == ExternExternalize) {
    pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    bVar1 = FeatureSet::hasGC(&pMVar2->features);
    shouldBeTrue<wasm::RefAs*>(this,bVar1,local_18,"extern.externalize requries GC [--enable-gc]");
    local_3c = unreachable;
    bVar1 = wasm::Type::operator==
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)72>).
                        super_Expression.type,&local_3c);
    if (!bVar1) {
      local_48.id = (local_18->value->type).id;
      HeapType::HeapType(&local_58,any);
      wasm::Type::Type(&local_50,local_58,Nullable);
      shouldBeSubType(this,local_48,local_50,local_18->value,
                      "extern.externalize value should be an anyref");
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitRefAs(RefAs* curr) {
  switch (curr->op) {
    default:
      // TODO: validate all the other ref.as_*
      break;
    case ExternInternalize: {
      shouldBeTrue(getModule()->features.hasGC(),
                   curr,
                   "extern.internalize requries GC [--enable-gc]");
      if (curr->type == Type::unreachable) {
        return;
      }
      shouldBeSubType(curr->value->type,
                      Type(HeapType::ext, Nullable),
                      curr->value,
                      "extern.internalize value should be an externref");
      break;
    }
    case ExternExternalize: {
      shouldBeTrue(getModule()->features.hasGC(),
                   curr,
                   "extern.externalize requries GC [--enable-gc]");
      if (curr->type == Type::unreachable) {
        return;
      }
      shouldBeSubType(curr->value->type,
                      Type(HeapType::any, Nullable),
                      curr->value,
                      "extern.externalize value should be an anyref");
      break;
    }
  }
}